

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

void __thiscall duckdb::BaseStatistics::Serialize(BaseStatistics *this,Serializer *serializer)

{
  StatisticsType SVar1;
  
  Serializer::WriteProperty<bool>(serializer,100,"has_null",&this->has_null);
  Serializer::WriteProperty<bool>(serializer,0x65,"has_no_null",&this->has_no_null);
  Serializer::WriteProperty<unsigned_long>(serializer,0x66,"distinct_count",&this->distinct_count);
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"type_stats");
  (*serializer->_vptr_Serializer[6])(serializer);
  SVar1 = GetStatsType(&this->type);
  switch(SVar1) {
  case NUMERIC_STATS:
    NumericStats::Serialize(this,serializer);
    break;
  case STRING_STATS:
    StringStats::Serialize(this,serializer);
    break;
  case LIST_STATS:
    ListStats::Serialize(this,serializer);
    break;
  case STRUCT_STATS:
    StructStats::Serialize(this,serializer);
    break;
  case ARRAY_STATS:
    ArrayStats::Serialize(this,serializer);
  }
  (*serializer->_vptr_Serializer[7])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void BaseStatistics::Serialize(Serializer &serializer) const {
	serializer.WriteProperty(100, "has_null", has_null);
	serializer.WriteProperty(101, "has_no_null", has_no_null);
	serializer.WriteProperty(102, "distinct_count", distinct_count);
	serializer.WriteObject(103, "type_stats", [&](Serializer &serializer) {
		switch (GetStatsType()) {
		case StatisticsType::NUMERIC_STATS:
			NumericStats::Serialize(*this, serializer);
			break;
		case StatisticsType::STRING_STATS:
			StringStats::Serialize(*this, serializer);
			break;
		case StatisticsType::LIST_STATS:
			ListStats::Serialize(*this, serializer);
			break;
		case StatisticsType::STRUCT_STATS:
			StructStats::Serialize(*this, serializer);
			break;
		case StatisticsType::ARRAY_STATS:
			ArrayStats::Serialize(*this, serializer);
			break;
		default:
			break;
		}
	});
}